

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_long_fs.c
# Opt level: O2

int check_long_fs(test_state *state)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = state->bytes_per_sample;
  uVar1 = state->strm->block_size;
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < (int)uVar1 / 2; lVar3 = lVar3 + 1) {
    (*state->out)(state->ubuf + lVar4,state->xmin,iVar2);
    (*state->out)(state->ubuf + lVar4 + (int)(iVar2 * uVar1) / 2,65000,iVar2);
    lVar4 = lVar4 + iVar2;
  }
  printf("Checking long fs ... ");
  iVar2 = (*state->codec)(state);
  if (iVar2 == 0) {
    puts("\x1b[0;32mPASS\x1b[0m");
  }
  return iVar2;
}

Assistant:

int check_long_fs(struct test_state *state)
{
    int status, size, i, bs;

    size = state->bytes_per_sample;
    bs = state->strm->block_size;

    for (i = 0; i < bs / 2; i++) {
        state->out(state->ubuf + size * i, state->xmin, size);
        state->out(state->ubuf + bs * size / 2 + size * i, 65000, size);
    }

    printf("Checking long fs ... ");

    status = state->codec(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}